

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall CVmRun::disp_string_val(CVmRun *this,uint caller_ofs,vm_obj_id_t self)

{
  vm_globalvar_t *funcptr;
  int iVar1;
  uchar *puVar2;
  vm_obj_id_t src_obj;
  vm_val_t val;
  vm_val_t self_val;
  
  if ((((self != 0 && this->say_method_ != 0) &&
       (iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[self >> 0xc][self & 0xfff].ptr_ + 0x68))
                          (G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff),this->say_method_,&val
                           ,self,&src_obj,0), iVar1 != 0)) && (val.typ < VM_FIRST_INVALID_TYPE)) &&
     ((0x60800U >> (val.typ & (VM_BIFPTR|VM_ENUM)) & 1) != 0)) {
    self_val.typ = VM_OBJ;
    self_val.val.obj = self;
    puVar2 = eval_prop_val(this,1,caller_ofs,&val,self,this->say_method_,&self_val,src_obj,1,
                           (vm_rcdesc *)0x0);
    return puVar2;
  }
  funcptr = this->say_func_;
  if ((funcptr != (vm_globalvar_t *)0x0) && ((funcptr->val).typ != VM_NIL)) {
    puVar2 = call_func_ptr(this,&funcptr->val,1,(vm_rcdesc *)0x0,caller_ofs);
    return puVar2;
  }
  err_throw(0x901);
}

Assistant:

const uchar *CVmRun::disp_string_val(VMG_ uint caller_ofs, vm_obj_id_t self)
{
    /* 
     *   if there's a valid 'self' object, and there's a default display
     *   method defined, and 'self' defines or inherits that method,
     *   invoke the method 
     */
    if (say_method_ != VM_INVALID_PROP && self != VM_INVALID_OBJ)
    {
        vm_obj_id_t src_obj;
        vm_val_t val;

        /* 
         *   look up the property - if we find it, and it's a regular
         *   method, invoke it 
         */
        if (vm_objp(vmg_ self)->get_prop(vmg_ say_method_, &val, self,
                                         &src_obj, 0)
            && (val.typ == VM_CODEOFS || val.typ == VM_OBJX
                || val.typ == VM_BIFPTRX))
        {
            /* set up a 'self' value - this is the target object */
            vm_val_t self_val;
            self_val.set_obj(self);

            /* there's a default display method - invoke it */
            return eval_prop_val(vmg_ TRUE, caller_ofs, &val, self,
                                 say_method_, &self_val, src_obj, 1, 0);
        }
    }
    
    /* if the "say" function isn't initialized, it's an error */
    if (say_func_ == 0 || say_func_->val.typ == VM_NIL)
        err_throw(VMERR_SAY_IS_NOT_DEFINED);

    /* call the "say" function with the argument at top of stack */
    return call_func_ptr(vmg_ &say_func_->val, 1, 0, caller_ofs);
}